

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::changeUpper(SPxLPBase<double> *this,int i,double *newUpper,bool scale)

{
  double *pdVar1;
  undefined7 in_register_00000009;
  double extraout_XMM0_Qa;
  double dVar2;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    dVar2 = *newUpper;
    ::soplex::infinity::__tls_init();
    pdVar1 = (double *)__tls_get_addr(&PTR_003b6b60);
    if (dVar2 < *pdVar1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x2c])(*newUpper,this->lp_scaler,this,i);
      dVar2 = extraout_XMM0_Qa;
      goto LAB_001e8b3f;
    }
  }
  dVar2 = *newUpper;
LAB_001e8b3f:
  (this->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar2;
  return;
}

Assistant:

virtual void changeUpper(int i, const R& newUpper, bool scale = false)
   {
      if(scale && newUpper < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::upper_w(i) = lp_scaler->scaleUpper(*this, i, newUpper);
      }
      else
         LPColSetBase<R>::upper_w(i) = newUpper;

      assert(isConsistent());
   }